

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::init
          (LayeredRenderCase *this,EVP_PKEY_CTX *ctx)

{
  GLuint *pGVar1;
  undefined1 *puVar2;
  code *pcVar3;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  bool bVar6;
  ContextType CVar7;
  int iVar8;
  deUint32 dVar9;
  GLenum GVar10;
  int extraout_EAX;
  RenderTarget *pRVar11;
  undefined4 extraout_var;
  TextureFormat texFormat;
  TransferFormat TVar13;
  undefined4 extraout_var_00;
  ShaderProgram *pSVar14;
  ProgramSources *pPVar15;
  ostream *poVar16;
  ostringstream *poVar17;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  NotSupportedError *pNVar18;
  TestError *pTVar19;
  char *pcVar20;
  undefined8 uVar21;
  deUint32 dVar22;
  undefined8 in_stack_fffffffffffffc28;
  undefined4 uVar23;
  int local_3c4;
  int local_3c0;
  allocator<char> local_3b9;
  GLuint *local_3b8;
  ContextType local_3ac;
  IVec3 texSize;
  ScopedLogSection section;
  ContextType local_378;
  ContextType local_374;
  undefined1 local_370 [40];
  int numSamples;
  string local_340 [32];
  int maxSamples;
  string local_300;
  ScopedLogSection section_1;
  string local_2c0;
  ostringstream buf;
  string local_120;
  ProgramSources local_100;
  long lVar12;
  
  uVar23 = (undefined4)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  CVar7.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(CVar7,(ApiType)0x23);
  if ((!bVar6) &&
     (bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar6)) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,"Tests require GL_EXT_geometry_shader extension or higher context version.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
               ,0xaca);
LAB_011f101e:
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_target == TARGET_2D_MS_ARRAY) {
    CVar7.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar6 = glu::contextSupports(CVar7,(ApiType)0x23);
    if ((!bVar6) &&
       (bVar6 = glu::ContextInfo::isExtensionSupported
                          (((this->super_TestCase).m_context)->m_contextInfo,
                           "GL_OES_texture_storage_multisample_2d_array"), !bVar6)) {
      pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar18,
                 "Test requires OES_texture_storage_multisample_2d_array extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xacd);
      goto LAB_011f101e;
    }
  }
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar11->m_width < (this->m_resolveDimensions).m_data[0]) ||
     (pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar11->m_height < (this->m_resolveDimensions).m_data[1])) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    maxSamples = (this->m_resolveDimensions).m_data[0];
    de::toString<int>((string *)&texSize,&maxSamples);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                   "Render target size must be at least ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                   "x");
    local_300._M_dataplus._M_p._0_4_ = (this->m_resolveDimensions).m_data[1];
    de::toString<int>((string *)&numSamples,(int *)&local_300);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numSamples)
    ;
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)&buf);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Rendering to the default layer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_SINGLE_LAYER:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Rendering to a single layer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_ALL_LAYERS:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Rendering to all layers.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_DIFFERENT_LAYERS:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Outputting different number of vertices to each layer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_INVOCATION_PER_LAYER:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Using a different invocation to output to each layer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Outputting to each layer from multiple invocations.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_LAYER_ID:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Using gl_Layer in fragment shader.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Verifying LAYER_PROVOKING_VERTEX.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_011efb16_default;
  }
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
switchD_011efb16_default:
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar8);
  getTargetDimensions((LayeredRenderCase *)&texSize,this->m_target);
  texFormat = glu::mapGLInternalFormat(0x8058);
  TVar13 = glu::getTransferFormat(texFormat);
  pGVar1 = &this->m_texture;
  (**(code **)(lVar12 + 0x6f8))(1,pGVar1);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"gen texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xb6f);
  dVar22 = TVar13.dataType;
  dVar9 = TVar13.format;
  switch(this->m_target) {
  case TARGET_CUBE:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    local_3b8 = pGVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Creating cubemap texture, size = ");
    std::ostream::operator<<(puVar2,texSize.m_data[0]);
    std::operator<<((ostream *)puVar2,"x");
    std::ostream::operator<<(puVar2,texSize.m_data[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
    (**(code **)(lVar12 + 0xb8))(0x8513,*local_3b8);
    (**(code **)(lVar12 + 0x1310))
              (0x8515,0,0x8058,texSize.m_data[0],texSize.m_data[1],0,dVar9,dVar22,0);
    (**(code **)(lVar12 + 0x1310))
              (0x8516,0,0x8058,texSize.m_data[0],texSize.m_data[1],0,dVar9,dVar22,0);
    (**(code **)(lVar12 + 0x1310))
              (0x8517,0,0x8058,texSize.m_data[0],texSize.m_data[1],0,dVar9,dVar22,0);
    (**(code **)(lVar12 + 0x1310))
              (0x8518,0,0x8058,texSize.m_data[0],texSize.m_data[1],0,dVar9,dVar22,0);
    (**(code **)(lVar12 + 0x1310))
              (0x8519,0,0x8058,texSize.m_data[0],texSize.m_data[1],0,dVar9,dVar22,0);
    uVar21 = 0x851a;
    goto LAB_011f0109;
  case TARGET_3D:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    local_3b8 = pGVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Creating 3d texture, size = ");
    local_3c4 = texSize.m_data[0];
    std::ostream::operator<<(puVar2,texSize.m_data[0]);
    std::operator<<((ostream *)puVar2,"x");
    local_3c0 = texSize.m_data[1];
    std::ostream::operator<<(puVar2,texSize.m_data[1]);
    std::operator<<((ostream *)puVar2,"x");
    std::ostream::operator<<(puVar2,texSize.m_data[2]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
    (**(code **)(lVar12 + 0xb8))(0x806f,*local_3b8);
    uVar21 = 0x806f;
    goto LAB_011f029e;
  case TARGET_1D_ARRAY:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    local_3b8 = pGVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Creating 1d texture array, size = ");
    std::ostream::operator<<(puVar2,texSize.m_data[0]);
    std::operator<<((ostream *)puVar2,", layers = ");
    std::ostream::operator<<(puVar2,texSize.m_data[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
    (**(code **)(lVar12 + 0xb8))(0x8c18,*local_3b8);
    uVar21 = 0x8c18;
LAB_011f0109:
    (**(code **)(lVar12 + 0x1310))
              (uVar21,0,0x8058,texSize.m_data[0],texSize.m_data[1],0,dVar9,dVar22,0);
    break;
  case TARGET_2D_ARRAY:
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    local_3b8 = pGVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Creating 2d texture array, size = ");
    local_3c4 = texSize.m_data[0];
    std::ostream::operator<<(puVar2,texSize.m_data[0]);
    std::operator<<((ostream *)puVar2,"x");
    local_3c0 = texSize.m_data[1];
    std::ostream::operator<<(puVar2,texSize.m_data[1]);
    std::operator<<((ostream *)puVar2,", layers = ");
    std::ostream::operator<<(puVar2,texSize.m_data[2]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
    (**(code **)(lVar12 + 0xb8))(0x8c1a,*local_3b8);
    uVar21 = 0x8c1a;
LAB_011f029e:
    (**(code **)(lVar12 + 0x1320))
              (uVar21,0,0x8058,local_3c4,local_3c0,texSize.m_data[2],0,dVar9,CONCAT44(uVar23,dVar22)
               ,0);
    break;
  case TARGET_2D_MS_ARRAY:
    numSamples = 2;
    maxSamples = 0;
    local_3b8 = pGVar1;
    (**(code **)(lVar12 + 0x868))(0x910e);
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
    std::operator<<((ostream *)puVar2,"Creating 2d multisample texture array, size = ");
    std::ostream::operator<<(puVar2,texSize.m_data[0]);
    std::operator<<((ostream *)puVar2,"x");
    std::ostream::operator<<(puVar2,texSize.m_data[1]);
    std::operator<<((ostream *)puVar2,", layers = ");
    std::ostream::operator<<(puVar2,texSize.m_data[2]);
    std::operator<<((ostream *)puVar2,", samples = ");
    std::ostream::operator<<(puVar2,2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
    if (maxSamples < 2) {
      pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>((string *)local_370,&numSamples);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                     ,"Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                     ," color texture samples.");
      tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)&buf);
      __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar12 + 0xb8))(0x9102,*local_3b8);
    (**(code **)(lVar12 + 0x13a8))
              (0x9102,2,0x8058,texSize.m_data[0],texSize.m_data[1],texSize.m_data[2],1);
  }
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"tex image",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xba4);
  GVar10 = getTargetTextureTarget(this->m_target);
  if (GVar10 != 0x9102) {
    (**(code **)(lVar12 + 0x1360))(GVar10,0x2800,0x2600);
    pcVar3 = *(code **)(lVar12 + 0x1360);
    GVar10 = getTargetTextureTarget(this->m_target);
    (*pcVar3)(GVar10,0x2801,0x2600);
    pcVar3 = *(code **)(lVar12 + 0x1360);
    GVar10 = getTargetTextureTarget(this->m_target);
    (*pcVar3)(GVar10,0x2802,0x2901);
    pcVar3 = *(code **)(lVar12 + 0x1360);
    GVar10 = getTargetTextureTarget(this->m_target);
    (*pcVar3)(GVar10,0x2803,0x2901);
    pcVar3 = *(code **)(lVar12 + 0x1360);
    GVar10 = getTargetTextureTarget(this->m_target);
    (*pcVar3)(GVar10,0x8072,0x2901);
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"tex filter",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0xbae);
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var_00,iVar8);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  puVar2 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar2);
  std::operator<<((ostream *)puVar2,"Creating FBO");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar2);
  (**(code **)(lVar12 + 0x6d0))(1,&this->m_fbo);
  (**(code **)(lVar12 + 0x78))(0x8d40,this->m_fbo);
  (**(code **)(lVar12 + 0x690))(0x8d40,0x8ce0,this->m_texture,0);
  (**(code **)(lVar12 + 0x78))(0x8d40,0);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xbbf);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"RenderToTextureShader",(allocator<char> *)local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Create layered rendering shader program",
             (allocator<char> *)&texSize);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,(string *)&buf,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&buf);
  pSVar14 = (ShaderProgram *)operator_new(0xd0);
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,
             "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
             ,&local_3b9);
  local_374.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_300,&local_2c0,&local_374);
  glu::VertexSource::VertexSource((VertexSource *)local_370,&local_300);
  pPVar15 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_370);
  local_3ac.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (this->m_test == TEST_LAYER_ID) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,
               "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(((gl_Layer % 2) == 1) ? 1.0 : 0.5,\n\t                 (((gl_Layer / 2) % 2) == 1) ? 1.0 : 0.5,\n\t                 (gl_Layer == 0) ? 1.0 : 0.0,\n\t                 1.0);\n}\n"
               ,(allocator<char> *)&numSamples);
    specializeShader((string *)&section_1,(string *)&buf,&local_3ac);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
               ,(allocator<char> *)&numSamples);
    specializeShader((string *)&section_1,(string *)&buf,&local_3ac);
  }
  std::__cxx11::string::~string((string *)&buf);
  glu::FragmentSource::FragmentSource((FragmentSource *)&texSize,(string *)&section_1);
  pPVar15 = glu::ProgramSources::operator<<(pPVar15,(ShaderSource *)&texSize);
  local_378.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  switch(this->m_test) {
  case TEST_ALL_LAYERS:
  case TEST_LAYER_ID:
    iVar8 = this->m_numLayers << 2;
    break;
  case TEST_DIFFERENT_LAYERS:
    iVar8 = (this->m_numLayers + 1) * this->m_numLayers;
    break;
  default:
    iVar8 = (uint)(this->m_test == TEST_LAYER_PROVOKING_VERTEX) * 2 + 4;
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    iVar8 = 6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar17 = &buf;
  std::operator<<(&poVar17->super_basic_ostream<char,_std::char_traits<char>_>,
                  "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}");
  if ((this->m_test & ~TEST_SINGLE_LAYER) == TEST_INVOCATION_PER_LAYER) {
    poVar16 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                              "layout(points, invocations=");
    poVar17 = (ostringstream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    pcVar20 = ") in;\n";
  }
  else {
    pcVar20 = "layout(points) in;\n";
  }
  std::operator<<(&poVar17->super_basic_ostream<char,_std::char_traits<char>_>,pcVar20);
  poVar17 = &buf;
  poVar16 = std::operator<<(&poVar17->super_basic_ostream<char,_std::char_traits<char>_>,
                            "layout(triangle_strip, max_vertices = ");
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar8);
  std::operator<<(poVar16,") out;\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n");
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    pcVar20 = 
    "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n"
    ;
    break;
  case TEST_SINGLE_LAYER:
    poVar16 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = "
                             );
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_targetLayer);
    poVar16 = std::operator<<(poVar16,
                              ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = "
                             );
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_targetLayer);
    poVar16 = std::operator<<(poVar16,
                              ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = "
                             );
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_targetLayer);
    poVar16 = std::operator<<(poVar16,
                              ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = "
                             );
    poVar17 = (ostringstream *)std::ostream::operator<<(poVar16,this->m_targetLayer);
    pcVar20 = ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n";
    break;
  case TEST_ALL_LAYERS:
  case TEST_LAYER_ID:
    poVar16 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\tconst highp vec4 white   = vec4(1.0, 1.0, 1.0, 1.0);\n\tconst highp vec4 red     = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green   = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue    = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow  = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 magenta = vec4(1.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 colors[6] = vec4[6](white, red, green, blue, yellow, magenta);\n\n\tfor (mediump int layerNdx = 0; layerNdx < "
                             );
    poVar17 = (ostringstream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    pcVar20 = 
    "; ++layerNdx)\n\t{\n\t\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n"
    ;
    break;
  case TEST_DIFFERENT_LAYERS:
    poVar16 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tfor (mediump int layerNdx = 0; layerNdx < "
                             );
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    poVar16 = std::operator<<(poVar16,
                              "; ++layerNdx)\n\t{\n\t\tfor (mediump int colNdx = 0; colNdx <= layerNdx; ++colNdx)\n\t\t{\n\t\t\thighp float posX = float(colNdx) / float("
                             );
    poVar17 = (ostringstream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    pcVar20 = 
    ") * 2.0 - 1.0;\n\n\t\t\tgl_Position = vec4(posX,  1.0, 0.0, 1.0);\n\t\t\tgl_Layer = layerNdx;\n\t\t\tv_frag_FragColor = white;\n\t\t\tEmitVertex();\n\n\t\t\tgl_Position = vec4(posX, -1.0, 0.0, 1.0);\n\t\t\tgl_Layer = layerNdx;\n\t\t\tv_frag_FragColor = white;\n\t\t\tEmitVertex();\n\t\t}\n\t\tEndPrimitive();\n\t}\n"
    ;
    break;
  case TEST_INVOCATION_PER_LAYER:
    pcVar20 = 
    "\tconst highp vec4 white   = vec4(1.0, 1.0, 1.0, 1.0);\n\tconst highp vec4 red     = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green   = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue    = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow  = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 magenta = vec4(1.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 colors[6] = vec4[6](white, red, green, blue, yellow, magenta);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\tEndPrimitive();\n"
    ;
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    poVar16 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tmediump int layerA = gl_InvocationID;\n\tmediump int layerB = (gl_InvocationID + 1) % "
                             );
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    poVar16 = std::operator<<(poVar16,";\n\thighp float aEnd = float(layerA) / float(");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    poVar16 = std::operator<<(poVar16,") * 2.0 - 1.0;\n\thighp float bEnd = float(layerB) / float(")
    ;
    poVar17 = (ostringstream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    pcVar20 = 
    ") * 2.0 - 1.0;\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n"
    ;
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    pcVar20 = 
    "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 0;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 0;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n"
    ;
    break;
  default:
    goto switchD_011f0737_default;
  }
  std::operator<<(&poVar17->super_basic_ostream<char,_std::char_traits<char>_>,pcVar20);
switchD_011f0737_default:
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  specializeShader(&local_120,(string *)&maxSamples,&local_378);
  std::__cxx11::string::~string((string *)&maxSamples);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  glu::GeometrySource::GeometrySource((GeometrySource *)&numSamples,&local_120);
  pPVar15 = glu::ProgramSources::operator<<(pPVar15,(ShaderSource *)&numSamples);
  glu::ShaderProgram::ShaderProgram(pSVar14,pRVar5,pPVar15);
  this->m_renderShader = pSVar14;
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)(texSize.m_data + 2));
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)(local_370 + 8));
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2c0);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_renderShader);
  if ((this->m_renderShader->m_program).m_info.linkOk == false) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"failed to build render shader",(allocator<char> *)&local_100);
    tcu::TestError::TestError(pTVar19,(string *)&buf);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"TextureSamplerShader",(allocator<char> *)local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Create shader sampler program",(allocator<char> *)&texSize);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar4,(string *)&buf,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&buf);
  pSVar14 = (ShaderProgram *)operator_new(0xd0);
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)&local_374);
  local_120._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)&maxSamples,&local_300,(ContextType *)&local_120);
  glu::VertexSource::VertexSource((VertexSource *)local_370,(string *)&maxSamples);
  pPVar15 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_370);
  section.m_log._0_4_ = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])()
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"${GLSL_VERSION_DECL}\n");
  if (this->m_target == TARGET_2D_MS_ARRAY) {
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "${GLSL_OES_TEXTURE_STORAGE_MULTISAMPLE}");
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "layout(location = 0) out mediump vec4 fragColor;\n");
  if ((ulong)this->m_target < 5) {
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    &DAT_01881564 + *(int *)(&DAT_01881564 + (ulong)this->m_target * 4));
  }
  poVar17 = &buf;
  std::operator<<(&poVar17->super_basic_ostream<char,_std::char_traits<char>_>,
                  "uniform highp int u_layer;\nvoid main (void)\n{\n");
  switch(this->m_target) {
  case TARGET_CUBE:
    poVar16 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\thighp vec2 facepos = 2.0 * gl_FragCoord.xy / vec2(ivec2(");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(this->m_resolveDimensions).m_data[0]);
    poVar16 = std::operator<<(poVar16,", ");
    poVar17 = (ostringstream *)
              std::ostream::operator<<(poVar16,(this->m_resolveDimensions).m_data[1]);
    pcVar20 = 
    ")) - vec2(1.0, 1.0);\n\tif (u_layer == 0)\n\t\tfragColor = textureLod(u_sampler, vec3(1.0, -facepos.y, -facepos.x), 0.0);\n\telse if (u_layer == 1)\n\t\tfragColor = textureLod(u_sampler, vec3(-1.0, -facepos.y, facepos.x), 0.0);\n\telse if (u_layer == 2)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, 1.0, facepos.y), 0.0);\n\telse if (u_layer == 3)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, -1.0, -facepos.y), 0.0);\n\telse if (u_layer == 4)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, -facepos.y, 1.0), 0.0);\n\telse if (u_layer == 5)\n\t\tfragColor = textureLod(u_sampler, vec3(-facepos.x, -facepos.y, -1.0), 0.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 1.0, 1.0);\n"
    ;
    break;
  case TARGET_3D:
  case TARGET_2D_ARRAY:
  case TARGET_2D_MS_ARRAY:
    pcVar20 = 
    "\thighp ivec2 screenpos = ivec2(floor(gl_FragCoord.xy));\n\tfragColor = texelFetch(u_sampler, ivec3(screenpos, u_layer), 0);\n"
    ;
    break;
  case TARGET_1D_ARRAY:
    pcVar20 = 
    "\thighp ivec2 screenpos = ivec2(floor(gl_FragCoord.xy));\n\tfragColor = texelFetch(u_sampler, ivec2(screenpos.x, u_layer), 0);\n"
    ;
    break;
  default:
    goto switchD_011f0bcc_default;
  }
  std::operator<<(&poVar17->super_basic_ostream<char,_std::char_traits<char>_>,pcVar20);
switchD_011f0bcc_default:
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  specializeShader(&local_2c0,(string *)&numSamples,(ContextType *)&section);
  std::__cxx11::string::~string((string *)&numSamples);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  glu::FragmentSource::FragmentSource((FragmentSource *)&texSize,&local_2c0);
  pPVar15 = glu::ProgramSources::operator<<(pPVar15,(ShaderSource *)&texSize);
  glu::ShaderProgram::ShaderProgram(pSVar14,pRVar5,pPVar15);
  this->m_samplerShader = pSVar14;
  std::__cxx11::string::~string((string *)(texSize.m_data + 2));
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)(local_370 + 8));
  std::__cxx11::string::~string((string *)&maxSamples);
  std::__cxx11::string::~string((string *)&local_300);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_samplerShader);
  if ((this->m_samplerShader->m_program).m_info.linkOk == false) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"failed to build sampler shader",(allocator<char> *)&local_100);
    tcu::TestError::TestError(pTVar19,(string *)&buf);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar8 = (**(code **)(CONCAT44(extraout_var_01,iVar8) + 0xb48))
                    ((this->m_samplerShader->m_program).m_program,"u_sampler");
  this->m_samplerSamplerLoc = iVar8;
  if (iVar8 == -1) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"u_sampler uniform location = -1",(allocator<char> *)&local_100);
    tcu::TestError::TestError(pTVar19,(string *)&buf);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar8 = (**(code **)(CONCAT44(extraout_var_02,iVar8) + 0xb48))
                    ((this->m_samplerShader->m_program).m_program,"u_layer");
  this->m_samplerLayerLoc = iVar8;
  if (iVar8 != -1) {
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
    return extraout_EAX;
  }
  pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"u_layer uniform location = -1",(allocator<char> *)&local_100);
  tcu::TestError::TestError(pTVar19,(string *)&buf);
  __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LayeredRenderCase::init (void)
{
	// Requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	if (m_target == TARGET_2D_MS_ARRAY && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension or higher context version.");

	if (m_context.getRenderTarget().getWidth() < m_resolveDimensions.x() || m_context.getRenderTarget().getHeight() < m_resolveDimensions.y())
		throw tcu::NotSupportedError("Render target size must be at least " + de::toString(m_resolveDimensions.x()) + "x" + de::toString(m_resolveDimensions.y()));

	// log what the test tries to do

	if (m_test == TEST_DEFAULT_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to the default layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_SINGLE_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to a single layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_ALL_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to all layers." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_DIFFERENT_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Outputting different number of vertices to each layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_INVOCATION_PER_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Using a different invocation to output to each layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_MULTIPLE_LAYERS_PER_INVOCATION)
		m_testCtx.getLog() << tcu::TestLog::Message << "Outputting to each layer from multiple invocations." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_LAYER_ID)
		m_testCtx.getLog() << tcu::TestLog::Message << "Using gl_Layer in fragment shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_LAYER_PROVOKING_VERTEX)
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying LAYER_PROVOKING_VERTEX." << tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	// init resources

	initTexture();
	initFbo();
	initRenderShader();
	initSamplerShader();
}